

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day03.cpp
# Opt level: O3

void day03(input_t input)

{
  short *psVar1;
  undefined2 uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined4 uVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  short sVar14;
  ulong uVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  undefined1 (*pauVar20) [16];
  char cVar21;
  __normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>
  __i;
  long lVar22;
  char *pcVar23;
  undefined1 (*pauVar24) [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  array<unsigned_short,_5UL> arr;
  array<unsigned_long,_17UL> row;
  array<unsigned_long,_17UL> collide;
  short local_182 [3];
  byte local_17c;
  undefined2 local_17a;
  ulong local_178;
  ulong local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong local_148 [2];
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  ulong local_b8 [17];
  undefined1 auVar27 [32];
  
  lVar22 = input.len;
  pcVar23 = input.s;
  pauVar13 = (undefined1 (*) [16])operator_new(36000);
  pauVar20 = pauVar13 + 0x8ca;
  if (lVar22 != 0) {
    sVar14 = 0;
    bVar7 = false;
    iVar11 = 0;
    pauVar17 = pauVar13;
    pauVar24 = pauVar13;
    do {
      pauVar13 = pauVar17;
      if ((byte)(*pcVar23 - 0x30U) < 10) {
        sVar14 = sVar14 * 10 + (ushort)(byte)(*pcVar23 - 0x30U);
        bVar10 = true;
      }
      else {
        bVar10 = false;
        if (bVar7) {
          lVar16 = (long)iVar11;
          iVar11 = iVar11 + 1;
          local_182[lVar16] = sVar14;
          if (iVar11 == 5) {
            if (pauVar24 == pauVar20) {
              local_178 = (long)pauVar24 - (long)pauVar17;
              if (local_178 == 0x7ffffffffffffff8) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              lVar16 = (long)local_178 >> 3;
              uVar18 = lVar16 * -0x5555555555555555;
              uVar15 = uVar18;
              if (pauVar24 == pauVar17) {
                uVar15 = 1;
              }
              local_170 = uVar15 + uVar18;
              if (0x555555555555554 < local_170) {
                local_170 = 0x555555555555555;
              }
              if (CARRY8(uVar15,uVar18)) {
                local_170 = 0x555555555555555;
              }
              if (local_170 == 0) {
                pauVar13 = (undefined1 (*) [16])0x0;
              }
              else {
                pauVar13 = (undefined1 (*) [16])operator_new(local_170 * 0x18);
              }
              *(short *)(pauVar13[1] + lVar16 * 8) = local_182[0];
              *(short *)(pauVar13[1] + lVar16 * 8 + 2) = local_182[2];
              *(undefined2 *)(pauVar13[1] + lVar16 * 8 + 4) = local_17a;
              pauVar13[1][lVar16 * 8 + 7] = 1;
              uVar12 = (ushort)local_182[1] & 0x3f;
              uVar18 = ~(-1L << ((ulong)local_17c & 0x3f));
              pauVar13[1][lVar16 * 8 + 6] = (char)((ushort)local_182[1] >> 6);
              uVar15 = uVar18 >> ((ulong)(byte)-(char)uVar12 & 0x3f);
              if ((ulong)uVar12 == 0) {
                uVar15 = 0;
              }
              *(ulong *)(*pauVar13 + lVar16 * 8) = uVar18 << (ulong)uVar12;
              *(ulong *)(*pauVar13 + lVar16 * 8 + 8) = uVar15;
              pauVar19 = pauVar13;
              for (pauVar20 = pauVar17; pauVar24 != pauVar20;
                  pauVar20 = (undefined1 (*) [16])(pauVar20[1] + 8)) {
                *(undefined8 *)pauVar19[1] = *(undefined8 *)pauVar20[1];
                uVar9 = *(undefined8 *)(*pauVar20 + 8);
                *(undefined8 *)*pauVar19 = *(undefined8 *)*pauVar20;
                *(undefined8 *)(*pauVar19 + 8) = uVar9;
                pauVar19 = (undefined1 (*) [16])(pauVar19[1] + 8);
              }
              if (pauVar17 != (undefined1 (*) [16])0x0) {
                operator_delete(pauVar17,local_178);
              }
              pauVar24 = (undefined1 (*) [16])(pauVar19[1] + 8);
              pauVar20 = (undefined1 (*) [16])((long)pauVar13 + local_170 * 0x18);
              iVar11 = 0;
            }
            else {
              *(short *)pauVar24[1] = local_182[0];
              *(short *)(pauVar24[1] + 2) = local_182[2];
              *(undefined2 *)(pauVar24[1] + 4) = local_17a;
              pauVar24[1][7] = 1;
              uVar12 = (ushort)local_182[1] & 0x3f;
              uVar15 = ~(-1L << ((ulong)local_17c & 0x3f));
              pauVar24[1][6] = (char)((ushort)local_182[1] >> 6);
              *(ulong *)*pauVar24 = uVar15 << (ulong)uVar12;
              uVar15 = uVar15 >> ((ulong)(byte)-(char)uVar12 & 0x3f);
              if ((ulong)uVar12 == 0) {
                uVar15 = 0;
              }
              iVar11 = 0;
              *(ulong *)(*pauVar24 + 8) = uVar15;
              pauVar24 = (undefined1 (*) [16])(pauVar24[1] + 8);
            }
          }
          sVar14 = 0;
          bVar10 = false;
        }
      }
      bVar7 = bVar10;
      lVar22 = lVar22 + -1;
      pcVar23 = pcVar23 + 1;
      pauVar17 = pauVar13;
    } while (lVar22 != 0);
    if (pauVar13 != pauVar24) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pauVar13,pauVar24,
                 (int)LZCOUNT(((long)pauVar24 - (long)pauVar13 >> 3) * -0x5555555555555555) * 2 ^
                 0x7e);
      if ((long)pauVar24 - (long)pauVar13 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pauVar13,pauVar24);
      }
      else {
        pauVar17 = pauVar13 + 0x18;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pauVar13,pauVar17);
        if (pauVar17 != pauVar24) {
          do {
            uVar2 = *(undefined2 *)pauVar17[1];
            uStack_138 = CONCAT62(uStack_138._2_6_,uVar2);
            local_148[0] = *(ulong *)*pauVar17;
            local_148[1] = *(ulong *)(*pauVar17 + 8);
            uVar3 = *(ushort *)(pauVar17[1] + 2);
            uVar5 = *(undefined4 *)(pauVar17[1] + 4);
            uVar4 = *(ushort *)(pauVar17[-1] + 10);
            pauVar19 = pauVar17;
            while (uVar4 < uVar3) {
              *(undefined8 *)pauVar19[1] = *(undefined8 *)(pauVar19[-1] + 8);
              *(undefined8 *)*pauVar19 = *(undefined8 *)(pauVar19[-2] + 8);
              *(undefined8 *)(*pauVar19 + 8) = *(undefined8 *)pauVar19[-1];
              uVar4 = *(ushort *)(pauVar19[-2] + 2);
              pauVar19 = (undefined1 (*) [16])(pauVar19[-2] + 8);
            }
            pauVar17 = (undefined1 (*) [16])(pauVar17[1] + 8);
            *(undefined2 *)pauVar19[1] = uVar2;
            *(ulong *)*pauVar19 = local_148[0];
            *(ulong *)(*pauVar19 + 8) = local_148[1];
            *(ushort *)(pauVar19[1] + 2) = uVar3;
            *(undefined4 *)(pauVar19[1] + 4) = uVar5;
          } while (pauVar17 != pauVar24);
          if (pauVar13 == pauVar24) goto LAB_00105072;
        }
      }
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar29 = vpbroadcastq_avx512f(ZEXT816(0x11));
      uVar15 = 0;
      uVar18 = 0;
      do {
        local_108 = 0;
        uStack_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        uStack_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        local_148[0] = 0;
        local_148[1] = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        uStack_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        local_c8 = 0;
        local_b8[0] = 0;
        local_b8[1] = 0;
        local_b8[2] = 0;
        local_b8[3] = 0;
        local_b8[4] = 0;
        local_b8[5] = 0;
        local_b8[6] = 0;
        local_b8[7] = 0;
        local_b8[8] = 0;
        local_b8[9] = 0;
        local_b8[10] = 0;
        local_b8[0xb] = 0;
        local_b8[0xc] = 0;
        local_b8[0xd] = 0;
        local_b8[0xe] = 0;
        local_b8[0xf] = 0;
        local_b8[0x10] = 0;
        if (pauVar24 != pauVar13) {
          sVar14 = *(short *)(pauVar24[-1] + 10);
          pauVar17 = pauVar24;
          do {
            if (*(short *)(pauVar17[-1] + 10) != sVar14) break;
            uVar8 = (ulong)(byte)pauVar17[-1][0xe];
            uVar6 = local_148[uVar8 + 1];
            local_b8[uVar8] = local_b8[uVar8] | *(ulong *)(pauVar17[-2] + 8) & local_148[uVar8];
            local_148[uVar8] = local_148[uVar8] | *(ulong *)(pauVar17[-2] + 8);
            local_b8[uVar8 + 1] = local_b8[uVar8 + 1] | *(ulong *)pauVar17[-1] & uVar6;
            pauVar19 = pauVar17 + -2;
            local_148[uVar8 + 1] = uVar6 | *(ulong *)pauVar17[-1];
            pauVar17 = (undefined1 (*) [16])(*pauVar19 + 8);
          } while ((undefined1 (*) [16])(*pauVar19 + 8) != pauVar13);
          if (pauVar24 != pauVar13) {
            pauVar17 = pauVar24;
            do {
              if (*(short *)(pauVar17[-1] + 10) != sVar14) break;
              cVar21 = pauVar17[-1][0xf];
              if ((cVar21 == '\x01') &&
                 (((local_b8[(byte)pauVar17[-1][0xe]] & *(ulong *)(pauVar17[-2] + 8)) != 0 ||
                  ((local_b8[(ulong)(byte)pauVar17[-1][0xe] + 1] & *(ulong *)pauVar17[-1]) != 0))))
              {
                cVar21 = '\0';
                pauVar17[-1][0xf] = 0;
              }
              *(short *)(pauVar17[-1] + 10) = sVar14 + 1;
              psVar1 = (short *)(pauVar17[-1] + 0xc);
              *psVar1 = *psVar1 + -1;
              pauVar19 = (undefined1 (*) [16])(pauVar17[-2] + 8);
              if (*psVar1 == 0) {
                if (cVar21 != '\0') {
                  uVar15 = (ulong)*(ushort *)(pauVar17[-1] + 8);
                }
                local_158 = *(undefined8 *)(pauVar17[-1] + 8);
                local_168 = *(undefined8 *)*pauVar19;
                uStack_160 = *(undefined8 *)pauVar17[-1];
                auVar25 = *pauVar19;
                *(undefined8 *)(pauVar17[-1] + 8) = *(undefined8 *)(pauVar24[-1] + 8);
                uVar9 = *(undefined8 *)pauVar24[-1];
                *(undefined8 *)*pauVar19 = *(undefined8 *)(pauVar24[-2] + 8);
                *(undefined8 *)pauVar17[-1] = uVar9;
                *(undefined8 *)(pauVar24[-1] + 8) = local_158;
                *(undefined1 (*) [16])(pauVar24[-2] + 8) = auVar25;
                pauVar24 = (undefined1 (*) [16])(pauVar24[-2] + 8);
              }
              pauVar17 = pauVar19;
            } while (pauVar19 != pauVar13);
          }
        }
        lVar22 = 0;
        auVar30 = ZEXT464((uint)uVar18);
        do {
          auVar32 = auVar30;
          auVar30 = vpbroadcastq_avx512f();
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar18 = vpcmpuq_avx512f(auVar30,auVar29,1);
          auVar30 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_b8 + lVar22));
          auVar31._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * auVar30._8_8_;
          auVar31._0_8_ = (ulong)((byte)uVar18 & 1) * auVar30._0_8_;
          auVar31._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * auVar30._16_8_;
          auVar31._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * auVar30._24_8_;
          auVar31._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * auVar30._32_8_;
          auVar31._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * auVar30._40_8_;
          auVar31._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * auVar30._48_8_;
          auVar31._56_8_ = (uVar18 >> 7) * auVar30._56_8_;
          lVar22 = lVar22 + 8;
          auVar30 = vpopcntq_avx512_vpopcntdq(auVar31);
          auVar26 = vpmovqd_avx512f(auVar30);
          auVar26 = vpaddd_avx2(auVar32._0_32_,auVar26);
          auVar30 = ZEXT3264(auVar26);
        } while (lVar22 != 0x18);
        auVar26 = vmovdqa32_avx512vl(auVar26);
        bVar7 = (bool)((byte)uVar18 & 1);
        auVar25._0_4_ = (uint)bVar7 * auVar26._0_4_ | (uint)!bVar7 * auVar32._0_4_;
        bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar7 * auVar26._4_4_ | (uint)!bVar7 * auVar32._4_4_;
        bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar7 * auVar26._8_4_ | (uint)!bVar7 * auVar32._8_4_;
        bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar7 * auVar26._12_4_ | (uint)!bVar7 * auVar32._12_4_;
        bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar7 * auVar26._16_4_ | (uint)!bVar7 * auVar32._16_4_;
        auVar27._0_16_ = auVar25;
        bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar7 * auVar26._20_4_ | (uint)!bVar7 * auVar32._20_4_;
        bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar7 * auVar26._24_4_ | (uint)!bVar7 * auVar32._24_4_;
        bVar7 = SUB81(uVar18 >> 7,0);
        auVar27._28_4_ = (uint)bVar7 * auVar26._28_4_ | (uint)!bVar7 * auVar32._28_4_;
        auVar25 = vphaddd_avx(auVar27._16_16_,auVar25);
        auVar25 = vphaddd_avx(auVar25,auVar25);
        auVar25 = vphaddd_avx(auVar25,auVar25);
        uVar18 = (ulong)auVar25._0_4_;
      } while (pauVar13 != pauVar24);
      goto LAB_0010525d;
    }
  }
LAB_00105072:
  uVar18 = 0;
  uVar15 = 0;
LAB_0010525d:
  printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n",uVar18,uVar15);
  if (pauVar13 == (undefined1 (*) [16])0x0) {
    return;
  }
  operator_delete(pauVar13,(long)pauVar20 - (long)pauVar13);
  return;
}

Assistant:

void day03(input_t input) {
	std::vector<claim_t> v;
	v.reserve(1500);

	std::array<uint16_t, 5> arr;
	for (int n = 0, have = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
			have = 1;
		} else if (have) {
			arr[i++] = n;
			if (i == 5) {
				v.emplace_back(arr);
				i = 0;
			}
			n = have = 0;
		}
	}

	// Sort by starting y-index
	std::sort(v.begin(), v.end());

	int part1 = 0, part2 = 0;

	/* Sweep vertically down the fabric, one row at a time,
	 * checking for collisions between claims.
	 */
	std::array<uint64_t, 17> row, collide;
	while (!v.empty()) {
		row.fill(0);
		collide.fill(0);

		auto y = v.back().y;
		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			collide[vi->idx + 0] |= row[vi->idx + 0] & vi->mask0;
			row[vi->idx + 0] |= vi->mask0;
			collide[vi->idx + 1] |= row[vi->idx + 1] & vi->mask1;
			row[vi->idx + 1] |= vi->mask1;
		}

		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			if (vi->part2) {
				if ((collide[vi->idx + 0] & vi->mask0) ||
				    (collide[vi->idx + 1] & vi->mask1))
				{
					vi->part2 = false;
				}
			}

			vi->y++;
			if (--vi->h == 0) {
				/* Reached the bottom of this claim; check for
				 * part2 solution and remove the claim
				 */
				if (vi->part2) {
					part2 = vi->id;
				}
				std::swap(*vi, v.back());
				v.pop_back();
			}
		}

		// Just tally up the 1-bits for part1
		for (auto c : collide) {
			part1 += _mm_popcnt_u64(c);
		}
	}

	printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n", part1, part2);
}